

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-util.c
# Opt level: O1

blow_effect * lookup_monster_blow_effect(char *eff_name)

{
  int iVar1;
  blow_effect *pbVar2;
  
  pbVar2 = blow_effects;
  if (blow_effects != (blow_effect *)0x0) {
    do {
      iVar1 = strcmp(pbVar2->name,eff_name);
      if (iVar1 == 0) {
        return pbVar2;
      }
      pbVar2 = pbVar2->next;
    } while (pbVar2 != (blow_effect *)0x0);
  }
  return pbVar2;
}

Assistant:

struct blow_effect *lookup_monster_blow_effect(const char *eff_name) {
	struct blow_effect *eff = &blow_effects[0];
	while (eff) {
		if (streq(eff->name, eff_name))
			break;
		eff = eff->next;
	}
	return eff;
}